

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_ops.cc
# Opt level: O2

void google::protobuf::internal::ReflectionOps::FindInitializationErrors
               (Message *message,string *prefix,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *errors)

{
  FieldDescriptor *this;
  bool bVar1;
  int iVar2;
  CppType CVar3;
  undefined4 extraout_var;
  Reflection *this_00;
  Message *pMVar5;
  ulong uVar6;
  long lVar7;
  int index;
  long lVar8;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  fields;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  long lVar4;
  
  iVar2 = (*(message->super_MessageLite)._vptr_MessageLite[0x15])();
  lVar4 = CONCAT44(extraout_var,iVar2);
  this_00 = GetReflectionOrDie(message);
  lVar7 = 0;
  for (lVar8 = 0; lVar8 < *(int *)(lVar4 + 0x68); lVar8 = lVar8 + 1) {
    if (*(int *)(*(long *)(lVar4 + 0x28) + 0x3c + lVar7) == 2) {
      bVar1 = Reflection::HasField
                        (this_00,message,(FieldDescriptor *)(*(long *)(lVar4 + 0x28) + lVar7));
      if (!bVar1) {
        std::operator+(&local_50,prefix,
                       *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                        (*(long *)(lVar4 + 0x28) + lVar7));
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)errors,
                   &local_50);
        std::__cxx11::string::~string((string *)&local_50);
      }
    }
    lVar7 = lVar7 + 0x98;
  }
  fields.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  fields.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  fields.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Reflection::ListFields(this_00,message,&fields);
  for (uVar6 = 0;
      uVar6 < (ulong)((long)fields.
                            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)fields.
                            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3); uVar6 = uVar6 + 1) {
    this = fields.
           super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
           ._M_impl.super__Vector_impl_data._M_start[uVar6];
    CVar3 = FieldDescriptor::cpp_type(this);
    if (CVar3 == CPPTYPE_MESSAGE) {
      if (*(int *)(this + 0x3c) == 3) {
        iVar2 = Reflection::FieldSize(this_00,message,this);
        index = 0;
        if (iVar2 < 1) {
          iVar2 = index;
        }
        for (; iVar2 != index; index = index + 1) {
          pMVar5 = Reflection::GetRepeatedMessage(this_00,message,this,index);
          SubMessagePrefix(&local_50,prefix,this,index);
          FindInitializationErrors(pMVar5,&local_50,errors);
          std::__cxx11::string::~string((string *)&local_50);
        }
      }
      else {
        pMVar5 = Reflection::GetMessage(this_00,message,this,(MessageFactory *)0x0);
        SubMessagePrefix(&local_50,prefix,this,-1);
        FindInitializationErrors(pMVar5,&local_50,errors);
        std::__cxx11::string::~string((string *)&local_50);
      }
    }
  }
  std::
  _Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::~_Vector_base(&fields.
                   super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 );
  return;
}

Assistant:

void ReflectionOps::FindInitializationErrors(const Message& message,
                                             const std::string& prefix,
                                             std::vector<std::string>* errors) {
  const Descriptor* descriptor = message.GetDescriptor();
  const Reflection* reflection = GetReflectionOrDie(message);

  // Check required fields of this message.
  for (int i = 0; i < descriptor->field_count(); i++) {
    if (descriptor->field(i)->is_required()) {
      if (!reflection->HasField(message, descriptor->field(i))) {
        errors->push_back(prefix + descriptor->field(i)->name());
      }
    }
  }

  // Check sub-messages.
  std::vector<const FieldDescriptor*> fields;
  reflection->ListFields(message, &fields);
  for (int i = 0; i < fields.size(); i++) {
    const FieldDescriptor* field = fields[i];
    if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {

      if (field->is_repeated()) {
        int size = reflection->FieldSize(message, field);

        for (int j = 0; j < size; j++) {
          const Message& sub_message =
              reflection->GetRepeatedMessage(message, field, j);
          FindInitializationErrors(sub_message,
                                   SubMessagePrefix(prefix, field, j), errors);
        }
      } else {
        const Message& sub_message = reflection->GetMessage(message, field);
        FindInitializationErrors(sub_message,
                                 SubMessagePrefix(prefix, field, -1), errors);
      }
    }
  }
}